

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O2

base_learner * cb_explore_adf_setup(options_i *options,vw *all)

{
  bool bVar1;
  int iVar2;
  option_group_definition *poVar3;
  typed_option<float> *ptVar4;
  ostream *poVar5;
  base_learner *l;
  multi_learner *base;
  multi_learner *pmVar6;
  learner<CB_EXPLORE_ADF::cb_explore_adf,_std::vector<example_*,_std::allocator<example_*>_>_>
  *plVar7;
  long lVar8;
  undefined **ppuVar9;
  label_parser *plVar10;
  size_t ws;
  byte bVar11;
  bool regcb;
  bool softmax;
  bool cb_explore_adf_option;
  free_ptr<CB_EXPLORE_ADF::cb_explore_adf> data;
  allocator local_1a42;
  allocator local_1a41;
  allocator local_1a40;
  allocator local_1a3f;
  allocator local_1a3e;
  allocator local_1a3d;
  allocator local_1a3c;
  allocator local_1a3b;
  allocator local_1a3a;
  allocator local_1a39;
  allocator local_1a38;
  allocator local_1a37;
  allocator local_1a36;
  allocator local_1a35;
  allocator local_1a34;
  allocator local_1a33;
  allocator local_1a32;
  allocator local_1a31;
  allocator local_1a30;
  allocator local_1a2f;
  allocator local_1a2e;
  allocator local_1a2d;
  allocator local_1a2c;
  allocator local_1a2b;
  allocator local_1a2a;
  allocator local_1a29;
  allocator local_1a28;
  allocator local_1a27;
  allocator local_1a26;
  allocator local_1a25;
  allocator local_1a24;
  allocator local_1a23;
  allocator local_1a22;
  allocator local_1a21;
  undefined1 local_1a20 [112];
  bool local_19b0;
  string type_string;
  undefined1 local_1960 [112];
  bool local_18f0;
  string local_18c0 [32];
  string local_18a0;
  string local_1880 [32];
  string local_1860;
  string local_1840 [32];
  string local_1820;
  string local_1800 [32];
  string local_17e0;
  string local_17c0 [32];
  string local_17a0;
  string local_1780 [32];
  string local_1760;
  string local_1740 [32];
  string local_1720;
  string local_1700 [32];
  string local_16e0;
  string local_16c0 [32];
  string local_16a0;
  string local_1680 [32];
  string local_1660;
  string local_1640 [32];
  string local_1620;
  string local_1600 [32];
  string local_15e0;
  string local_15c0 [32];
  string local_15a0;
  string local_1580 [32];
  string local_1560;
  string local_1540 [32];
  string local_1520;
  string local_1500 [32];
  string local_14e0;
  string local_14c0 [32];
  string local_14a0;
  string local_1480;
  option_group_definition new_options;
  undefined1 local_1428 [112];
  bool local_13b8;
  undefined1 local_1388 [112];
  bool local_1318;
  undefined1 local_12e8 [112];
  bool local_1278;
  undefined1 local_1248 [112];
  bool local_11d8;
  undefined1 local_11a8 [112];
  bool local_1138;
  undefined1 local_1108 [112];
  bool local_1098;
  undefined1 local_1068 [112];
  bool local_ff8;
  undefined1 local_fc8 [112];
  bool local_f58;
  undefined1 local_f28 [112];
  bool local_eb8;
  undefined1 local_e88 [112];
  bool local_e18;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_de8;
  typed_option<float> local_d48;
  typed_option<float> local_ca8;
  typed_option<bool> local_c08;
  typed_option<float> local_b68;
  typed_option<float> local_ac8;
  typed_option<float> local_a28;
  typed_option<float> local_988;
  typed_option<bool> local_8e8;
  typed_option<float> local_848;
  typed_option<float> local_7a8;
  typed_option<bool> local_708;
  typed_option<bool> local_668;
  typed_option<bool> local_5c8;
  typed_option<bool> local_528;
  typed_option<float> local_488;
  typed_option<float> local_3e8;
  typed_option<unsigned_long> local_348;
  typed_option<unsigned_long> local_2a8;
  typed_option<float> local_208;
  typed_option<unsigned_long> local_168;
  typed_option<bool> local_c8;
  
  bVar11 = 0;
  scoped_calloc_or_throw<CB_EXPLORE_ADF::cb_explore_adf>();
  cb_explore_adf_option = false;
  softmax = false;
  regcb = false;
  std::__cxx11::string::string((string *)&type_string,"ips",(allocator *)local_1a20);
  std::__cxx11::string::string
            ((string *)&local_1480,"Contextual Bandit Exploration with Action Dependent Features",
             (allocator *)local_1a20);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_1480);
  std::__cxx11::string::~string((string *)&local_1480);
  std::__cxx11::string::string((string *)&local_14a0,"cb_explore_adf",&local_1a21);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1a20,&local_14a0,&cb_explore_adf_option);
  local_19b0 = true;
  std::__cxx11::string::string
            (local_14c0,
             "Online explore-exploit for a contextual bandit problem with multiline action dependent features"
             ,&local_1a22);
  std::__cxx11::string::_M_assign((string *)(local_1a20 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_c8,(typed_option<bool> *)local_1a20);
  poVar3 = VW::config::option_group_definition::add<bool>(&new_options,&local_c8);
  std::__cxx11::string::string((string *)&local_14e0,"first",&local_1a23);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_1960,&local_14e0,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->tau);
  local_18f0 = true;
  std::__cxx11::string::string(local_1500,"tau-first exploration",&local_1a24);
  std::__cxx11::string::_M_assign((string *)(local_1960 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_168,(typed_option<unsigned_long> *)local_1960);
  poVar3 = VW::config::option_group_definition::add<unsigned_long>(poVar3,&local_168);
  std::__cxx11::string::string((string *)&local_1520,"epsilon",&local_1a25);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_1388,&local_1520,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->epsilon
            );
  local_1318 = true;
  std::__cxx11::string::string(local_1540,"epsilon-greedy exploration",&local_1a26);
  std::__cxx11::string::_M_assign((string *)(local_1388 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_208,(typed_option<float> *)local_1388);
  poVar3 = VW::config::option_group_definition::add<float>(poVar3,&local_208);
  std::__cxx11::string::string((string *)&local_1560,"bag",&local_1a27);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_1428,&local_1560,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
              bag_size);
  local_13b8 = true;
  std::__cxx11::string::string(local_1580,"bagging-based exploration",&local_1a28);
  std::__cxx11::string::_M_assign((string *)(local_1428 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_2a8,(typed_option<unsigned_long> *)local_1428);
  poVar3 = VW::config::option_group_definition::add<unsigned_long>(poVar3,&local_2a8);
  std::__cxx11::string::string((string *)&local_15a0,"cover",&local_1a29);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_e88,&local_15a0,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
              cover_size);
  local_e18 = true;
  std::__cxx11::string::string(local_15c0,"Online cover based exploration",&local_1a2a);
  std::__cxx11::string::_M_assign((string *)(local_e88 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_348,(typed_option<unsigned_long> *)local_e88);
  poVar3 = VW::config::option_group_definition::add<unsigned_long>(poVar3,&local_348);
  std::__cxx11::string::string((string *)&local_15e0,"psi",&local_1a2b);
  VW::config::typed_option<float>::typed_option
            (&local_488,&local_15e0,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->psi);
  local_488.super_base_option.m_keep = true;
  ptVar4 = VW::config::typed_option<float>::default_value(&local_488,1.0);
  std::__cxx11::string::string(local_1600,"disagreement parameter for cover",&local_1a2c);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_3e8,ptVar4);
  poVar3 = VW::config::option_group_definition::add<float>(poVar3,&local_3e8);
  std::__cxx11::string::string((string *)&local_1620,"nounif",&local_1a2d);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_f28,&local_1620,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->nounif)
  ;
  local_eb8 = true;
  std::__cxx11::string::string
            (local_1640,"do not explore uniformly on zero-probability actions in cover",&local_1a2e)
  ;
  std::__cxx11::string::_M_assign((string *)(local_f28 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_528,(typed_option<bool> *)local_f28);
  poVar3 = VW::config::option_group_definition::add<bool>(poVar3,&local_528);
  std::__cxx11::string::string((string *)&local_1660,"softmax",&local_1a2f);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_fc8,&local_1660,&softmax)
  ;
  local_f58 = true;
  std::__cxx11::string::string(local_1680,"softmax exploration",&local_1a30);
  std::__cxx11::string::_M_assign((string *)(local_fc8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_5c8,(typed_option<bool> *)local_fc8);
  poVar3 = VW::config::option_group_definition::add<bool>(poVar3,&local_5c8);
  std::__cxx11::string::string((string *)&local_16a0,"regcb",&local_1a31);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_1068,&local_16a0,&regcb);
  local_ff8 = true;
  std::__cxx11::string::string(local_16c0,"RegCB-elim exploration",&local_1a32);
  std::__cxx11::string::_M_assign((string *)(local_1068 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_668,(typed_option<bool> *)local_1068);
  poVar3 = VW::config::option_group_definition::add<bool>(poVar3,&local_668);
  std::__cxx11::string::string((string *)&local_16e0,"regcbopt",&local_1a33);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1108,&local_16e0,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
              regcbopt);
  local_1098 = true;
  std::__cxx11::string::string(local_1700,"RegCB optimistic exploration",&local_1a34);
  std::__cxx11::string::_M_assign((string *)(local_1108 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_708,(typed_option<bool> *)local_1108);
  poVar3 = VW::config::option_group_definition::add<bool>(poVar3,&local_708);
  std::__cxx11::string::string((string *)&local_1720,"mellowness",&local_1a35);
  VW::config::typed_option<float>::typed_option
            (&local_848,&local_1720,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->c0);
  local_848.super_base_option.m_keep = true;
  ptVar4 = VW::config::typed_option<float>::default_value(&local_848,0.1);
  std::__cxx11::string::string(local_1740,"RegCB mellowness parameter c_0. Default 0.1",&local_1a36)
  ;
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_7a8,ptVar4);
  poVar3 = VW::config::option_group_definition::add<float>(poVar3,&local_7a8);
  std::__cxx11::string::string((string *)&local_1760,"greedify",&local_1a37);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_11a8,&local_1760,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
              greedify);
  local_1138 = true;
  std::__cxx11::string::string(local_1780,"always update first policy once in bagging",&local_1a38);
  std::__cxx11::string::_M_assign((string *)(local_11a8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_8e8,(typed_option<bool> *)local_11a8);
  poVar3 = VW::config::option_group_definition::add<bool>(poVar3,&local_8e8);
  std::__cxx11::string::string((string *)&local_17a0,"cb_min_cost",&local_1a39);
  VW::config::typed_option<float>::typed_option
            (&local_a28,&local_17a0,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
              min_cb_cost);
  local_a28.super_base_option.m_keep = true;
  ptVar4 = VW::config::typed_option<float>::default_value(&local_a28,0.0);
  std::__cxx11::string::string(local_17c0,"lower bound on cost",&local_1a3a);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_988,ptVar4);
  poVar3 = VW::config::option_group_definition::add<float>(poVar3,&local_988);
  std::__cxx11::string::string((string *)&local_17e0,"cb_max_cost",&local_1a3b);
  VW::config::typed_option<float>::typed_option
            (&local_b68,&local_17e0,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
              max_cb_cost);
  local_b68.super_base_option.m_keep = true;
  ptVar4 = VW::config::typed_option<float>::default_value(&local_b68,1.0);
  std::__cxx11::string::string(local_1800,"upper bound on cost",&local_1a3c);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_ac8,ptVar4);
  poVar3 = VW::config::option_group_definition::add<float>(poVar3,&local_ac8);
  std::__cxx11::string::string((string *)&local_1820,"first_only",&local_1a3d);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1248,&local_1820,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
              first_only);
  local_11d8 = true;
  std::__cxx11::string::string
            (local_1840,"Only explore the first action in a tie-breaking event",&local_1a3e);
  std::__cxx11::string::_M_assign((string *)(local_1248 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_c08,(typed_option<bool> *)local_1248);
  poVar3 = VW::config::option_group_definition::add<bool>(poVar3,&local_c08);
  std::__cxx11::string::string((string *)&local_1860,"lambda",&local_1a3f);
  VW::config::typed_option<float>::typed_option
            (&local_d48,&local_1860,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->lambda)
  ;
  local_d48.super_base_option.m_keep = true;
  ptVar4 = VW::config::typed_option<float>::default_value(&local_d48,-1.0);
  std::__cxx11::string::string(local_1880,"parameter for softmax",&local_1a40);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_ca8,ptVar4);
  poVar3 = VW::config::option_group_definition::add<float>(poVar3,&local_ca8);
  std::__cxx11::string::string((string *)&local_18a0,"cb_type",&local_1a41);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_12e8,&local_18a0,&type_string);
  local_1278 = true;
  std::__cxx11::string::string
            (local_18c0,"contextual bandit method to use in {ips,dm,dr}",&local_1a42);
  std::__cxx11::string::_M_assign((string *)(local_12e8 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_de8,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_12e8);
  VW::config::option_group_definition::add<std::__cxx11::string>(poVar3,&local_de8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_de8);
  std::__cxx11::string::~string(local_18c0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_12e8);
  std::__cxx11::string::~string((string *)&local_18a0);
  VW::config::typed_option<float>::~typed_option(&local_ca8);
  std::__cxx11::string::~string(local_1880);
  VW::config::typed_option<float>::~typed_option(&local_d48);
  std::__cxx11::string::~string((string *)&local_1860);
  VW::config::typed_option<bool>::~typed_option(&local_c08);
  std::__cxx11::string::~string(local_1840);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_1248);
  std::__cxx11::string::~string((string *)&local_1820);
  VW::config::typed_option<float>::~typed_option(&local_ac8);
  std::__cxx11::string::~string(local_1800);
  VW::config::typed_option<float>::~typed_option(&local_b68);
  std::__cxx11::string::~string((string *)&local_17e0);
  VW::config::typed_option<float>::~typed_option(&local_988);
  std::__cxx11::string::~string(local_17c0);
  VW::config::typed_option<float>::~typed_option(&local_a28);
  std::__cxx11::string::~string((string *)&local_17a0);
  VW::config::typed_option<bool>::~typed_option(&local_8e8);
  std::__cxx11::string::~string(local_1780);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_11a8);
  std::__cxx11::string::~string((string *)&local_1760);
  VW::config::typed_option<float>::~typed_option(&local_7a8);
  std::__cxx11::string::~string(local_1740);
  VW::config::typed_option<float>::~typed_option(&local_848);
  std::__cxx11::string::~string((string *)&local_1720);
  VW::config::typed_option<bool>::~typed_option(&local_708);
  std::__cxx11::string::~string(local_1700);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_1108);
  std::__cxx11::string::~string((string *)&local_16e0);
  VW::config::typed_option<bool>::~typed_option(&local_668);
  std::__cxx11::string::~string(local_16c0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_1068);
  std::__cxx11::string::~string((string *)&local_16a0);
  VW::config::typed_option<bool>::~typed_option(&local_5c8);
  std::__cxx11::string::~string(local_1680);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_fc8);
  std::__cxx11::string::~string((string *)&local_1660);
  VW::config::typed_option<bool>::~typed_option(&local_528);
  std::__cxx11::string::~string(local_1640);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_f28);
  std::__cxx11::string::~string((string *)&local_1620);
  VW::config::typed_option<float>::~typed_option(&local_3e8);
  std::__cxx11::string::~string(local_1600);
  VW::config::typed_option<float>::~typed_option(&local_488);
  std::__cxx11::string::~string((string *)&local_15e0);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_348);
  std::__cxx11::string::~string(local_15c0);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_e88);
  std::__cxx11::string::~string((string *)&local_15a0);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_2a8);
  std::__cxx11::string::~string(local_1580);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_1428);
  std::__cxx11::string::~string((string *)&local_1560);
  VW::config::typed_option<float>::~typed_option(&local_208);
  std::__cxx11::string::~string(local_1540);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_1388);
  std::__cxx11::string::~string((string *)&local_1520);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_168);
  std::__cxx11::string::~string(local_1500);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_1960);
  std::__cxx11::string::~string((string *)&local_14e0);
  VW::config::typed_option<bool>::~typed_option(&local_c8);
  std::__cxx11::string::~string(local_14c0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_1a20);
  std::__cxx11::string::~string((string *)&local_14a0);
  (**options->_vptr_options_i)(options,&new_options);
  if (cb_explore_adf_option == false) {
    plVar7 = (learner<CB_EXPLORE_ADF::cb_explore_adf,_std::vector<example_*,_std::allocator<example_*>_>_>
              *)0x0;
    goto LAB_001d7be8;
  }
  std::__cxx11::string::string((string *)local_1a20,"cb_type",(allocator *)local_1960);
  iVar2 = (*options->_vptr_options_i[1])(options,local_1a20);
  std::__cxx11::string::~string((string *)local_1a20);
  if ((char)iVar2 == '\0') {
    std::__cxx11::string::string((string *)local_1a20,"cb_type",(allocator *)local_1960);
    (*options->_vptr_options_i[5])(options,local_1a20,&type_string);
    std::__cxx11::string::~string((string *)local_1a20);
    (**options->_vptr_options_i)(options,&new_options);
  }
  (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
   super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->all = all;
  if (0.0 < (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
             super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
             super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->lambda) {
    (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->lambda =
         -(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
           super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->lambda;
  }
  std::__cxx11::string::string((string *)local_1a20,"cb_adf",(allocator *)local_1960);
  iVar2 = (*options->_vptr_options_i[1])(options,local_1a20);
  std::__cxx11::string::~string((string *)local_1a20);
  if ((char)iVar2 == '\0') {
    std::__cxx11::string::string((string *)local_1a20,"cb_adf",(allocator *)local_1388);
    std::__cxx11::string::string((string *)local_1960,"",(allocator *)local_1428);
    (*options->_vptr_options_i[5])(options,local_1a20,local_1960);
    std::__cxx11::string::~string((string *)local_1960);
    std::__cxx11::string::~string((string *)local_1a20);
  }
  all->delete_prediction = ACTION_SCORE::delete_action_scores;
  std::__cxx11::string::string((string *)local_1a20,"cover",(allocator *)local_1960);
  iVar2 = (*options->_vptr_options_i[1])(options,local_1a20);
  std::__cxx11::string::~string((string *)local_1a20);
  if ((char)iVar2 == '\0') {
    std::__cxx11::string::string((string *)local_1a20,"bag",(allocator *)local_1960);
    iVar2 = (*options->_vptr_options_i[1])(options,local_1a20);
    std::__cxx11::string::~string((string *)local_1a20);
    if ((char)iVar2 == '\0') {
      std::__cxx11::string::string((string *)local_1a20,"first",(allocator *)local_1960);
      iVar2 = (*options->_vptr_options_i[1])(options,local_1a20);
      std::__cxx11::string::~string((string *)local_1a20);
      ws = 1;
      if ((char)iVar2 == '\0') {
        if (softmax == true) {
          (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
           super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
          explore_type = 3;
        }
        else if (regcb == false) {
          std::__cxx11::string::string((string *)local_1a20,"regcbopt",(allocator *)local_1960);
          iVar2 = (*options->_vptr_options_i[1])(options,local_1a20);
          if ((char)iVar2 == '\0') {
            std::__cxx11::string::~string((string *)local_1a20);
          }
          else {
            bVar1 = (data._M_t.
                     super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
                     super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
                     super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
                    regcbopt;
            std::__cxx11::string::~string((string *)local_1a20);
            if (bVar1 == true) goto LAB_001d78b1;
          }
          std::__cxx11::string::string((string *)local_1a20,"epsilon",(allocator *)local_1960);
          iVar2 = (*options->_vptr_options_i[1])(options,local_1a20);
          std::__cxx11::string::~string((string *)local_1a20);
          if ((char)iVar2 == '\0') {
            (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
             super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
             super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->epsilon =
                 0.05;
          }
          (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
           super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
          explore_type = 1;
        }
        else {
LAB_001d78b1:
          (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
           super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
          explore_type = 5;
        }
      }
      else {
        (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->explore_type
             = 0;
      }
    }
    else {
      (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->explore_type =
           2;
      ws = (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
            super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->bag_size;
    }
  }
  else {
    (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->explore_type = 4;
    ws = (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
          super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->cover_size +
         1;
  }
  ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
    super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->gen_cs).cb_type =
       2;
  std::__cxx11::string::string((string *)local_1a20,"cb_type",(allocator *)local_1960);
  iVar2 = (*options->_vptr_options_i[1])(options,local_1a20);
  std::__cxx11::string::~string((string *)local_1a20);
  if ((char)iVar2 != '\0') {
    iVar2 = std::__cxx11::string::compare((char *)&type_string);
    if (iVar2 == 0) {
      ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
        super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
        super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->gen_cs).
      cb_type = 0;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&type_string);
      if (iVar2 == 0) {
        ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
          super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->gen_cs).
        cb_type = 2;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&type_string);
        if (iVar2 == 0) {
          std::__cxx11::string::string((string *)local_1a20,"cover",(allocator *)local_1960);
          iVar2 = (*options->_vptr_options_i[1])(options,local_1a20);
          std::__cxx11::string::~string((string *)local_1a20);
          if ((char)iVar2 != '\0') {
            poVar5 = std::operator<<(&(all->trace_message).super_ostream,
                                     "warning: currently, mtr is only used for the first policy in cover, other policies use dr"
                                    );
            std::endl<char,std::char_traits<char>>(poVar5);
          }
          ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
            super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->gen_cs).
          cb_type = 3;
        }
        else {
          poVar5 = std::operator<<(&(all->trace_message).super_ostream,
                                   "warning: cb_type must be in {\'ips\',\'dr\',\'mtr\'}; resetting to ips."
                                  );
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::string::string((string *)local_1a20,"cb_type",(allocator *)local_1388);
          std::__cxx11::string::string((string *)local_1960,"ips",(allocator *)local_1428);
          (*options->_vptr_options_i[6])(options,local_1a20,local_1960);
          std::__cxx11::string::~string((string *)local_1960);
          std::__cxx11::string::~string((string *)local_1a20);
        }
      }
    }
    if (((data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
          super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->explore_type
         == 5) &&
       (((data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
          super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->gen_cs).
        cb_type != 3)) {
      poVar5 = std::operator<<(&(all->trace_message).super_ostream,
                               "warning: bad cb_type, RegCB only supports mtr!");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  l = setup_base(options,all);
  base = LEARNER::as_multiline<char,char>(l);
  ppuVar9 = &CB::cb_label;
  plVar10 = &all->p->lp;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    plVar10->default_label = (_func_void_void_ptr *)*ppuVar9;
    ppuVar9 = ppuVar9 + (ulong)bVar11 * -2 + 1;
    plVar10 = (label_parser *)((long)plVar10 + (ulong)bVar11 * -0x10 + 8);
  }
  all->label_type = cb;
  ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
    super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->gen_cs).scorer =
       all->scorer;
  pmVar6 = LEARNER::as_multiline<char,char>(all->cost_sensitive);
  (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
   super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->cs_ldf_learner =
       pmVar6;
  plVar7 = LEARNER::
           learner<CB_EXPLORE_ADF::cb_explore_adf,std::vector<example*,std::allocator<example*>>>::
           init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                     (data._M_t.
                      super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
                      super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
                      super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl,
                      base,CB_EXPLORE_ADF::do_actual_learning<true>,
                      CB_EXPLORE_ADF::do_actual_learning<false>,ws,action_probs);
  data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
  super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl =
       (cb_explore_adf *)0x0;
  *(undefined8 *)(plVar7 + 0x58) = *(undefined8 *)(plVar7 + 0x18);
  *(code **)(plVar7 + 0x68) = CB_EXPLORE_ADF::finish_multiline_example;
  *(undefined8 *)(plVar7 + 0xb8) = *(undefined8 *)(plVar7 + 0x18);
  *(undefined8 *)(plVar7 + 0xc0) = *(undefined8 *)(plVar7 + 0x20);
  *(code **)(plVar7 + 200) = CB_EXPLORE_ADF::finish;
LAB_001d7be8:
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::__cxx11::string::~string((string *)&type_string);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar7;
}

Assistant:

base_learner* cb_explore_adf_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cb_explore_adf>();
  bool cb_explore_adf_option = false;
  bool softmax = false;
  bool regcb = false;
  std::string type_string = "ips";
  option_group_definition new_options("Contextual Bandit Exploration with Action Dependent Features");
  new_options
      .add(make_option("cb_explore_adf", cb_explore_adf_option)
               .keep()
               .help("Online explore-exploit for a contextual bandit problem with multiline action dependent features"))
      .add(make_option("first", data->tau).keep().help("tau-first exploration"))
      .add(make_option("epsilon", data->epsilon).keep().help("epsilon-greedy exploration"))
      .add(make_option("bag", data->bag_size).keep().help("bagging-based exploration"))
      .add(make_option("cover", data->cover_size).keep().help("Online cover based exploration"))
      .add(make_option("psi", data->psi).keep().default_value(1.0f).help("disagreement parameter for cover"))
      .add(make_option("nounif", data->nounif)
               .keep()
               .help("do not explore uniformly on zero-probability actions in cover"))
      .add(make_option("softmax", softmax).keep().help("softmax exploration"))
      .add(make_option("regcb", regcb).keep().help("RegCB-elim exploration"))
      .add(make_option("regcbopt", data->regcbopt).keep().help("RegCB optimistic exploration"))
      .add(make_option("mellowness", data->c0)
               .keep()
               .default_value(0.1f)
               .help("RegCB mellowness parameter c_0. Default 0.1"))
      .add(make_option("greedify", data->greedify).keep().help("always update first policy once in bagging"))
      .add(make_option("cb_min_cost", data->min_cb_cost).keep().default_value(0.f).help("lower bound on cost"))
      .add(make_option("cb_max_cost", data->max_cb_cost).keep().default_value(1.f).help("upper bound on cost"))
      .add(make_option("first_only", data->first_only)
               .keep()
               .help("Only explore the first action in a tie-breaking event"))
      .add(make_option("lambda", data->lambda).keep().default_value(-1.f).help("parameter for softmax"))
      .add(make_option("cb_type", type_string).keep().help("contextual bandit method to use in {ips,dm,dr}"));
  options.add_and_parse(new_options);

  if (!cb_explore_adf_option)
    return nullptr;

  // Ensure serialization of this option in all cases.
  if (!options.was_supplied("cb_type"))
  {
    options.insert("cb_type", type_string);
    options.add_and_parse(new_options);
  }

  data->all = &all;
  if (data->lambda > 0)  // Lambda should always be negative because we are using a cost basis.
    data->lambda = -data->lambda;

  if (!options.was_supplied("cb_adf"))
  {
    options.insert("cb_adf", "");
  }

  all.delete_prediction = delete_action_scores;

  size_t problem_multiplier = 1;

  if (options.was_supplied("cover"))
  {
    data->explore_type = COVER;
    problem_multiplier = data->cover_size + 1;
  }
  else if (options.was_supplied("bag"))
  {
    data->explore_type = BAG_EXPLORE;
    problem_multiplier = data->bag_size;
  }
  else if (options.was_supplied("first"))
    data->explore_type = EXPLORE_FIRST;
  else if (softmax)
    data->explore_type = SOFTMAX;
  else if (regcb || (options.was_supplied("regcbopt") && data->regcbopt))
    data->explore_type = REGCB;
  else
  {
    if (!options.was_supplied("epsilon"))
      data->epsilon = 0.05f;
    data->explore_type = EPS_GREEDY;
  }

  data->gen_cs.cb_type = CB_TYPE_IPS;
  if (options.was_supplied("cb_type"))
  {
    if (type_string.compare("dr") == 0)
      data->gen_cs.cb_type = CB_TYPE_DR;
    else if (type_string.compare("ips") == 0)
      data->gen_cs.cb_type = CB_TYPE_IPS;
    else if (type_string.compare("mtr") == 0)
    {
      if (options.was_supplied("cover"))
        all.trace_message << "warning: currently, mtr is only used for the first policy in cover, other policies use dr"
                          << endl;
      data->gen_cs.cb_type = CB_TYPE_MTR;
    }
    else
    {
      all.trace_message << "warning: cb_type must be in {'ips','dr','mtr'}; resetting to ips." << std::endl;
      options.replace("cb_type", "ips");
    }

    if (data->explore_type == REGCB && data->gen_cs.cb_type != CB_TYPE_MTR)
      all.trace_message << "warning: bad cb_type, RegCB only supports mtr!" << std::endl;
  }

  multi_learner* base = as_multiline(setup_base(options, all));
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  // Extract from lower level reductions.
  data->gen_cs.scorer = all.scorer;
  data->cs_ldf_learner = as_multiline(all.cost_sensitive);

  learner<cb_explore_adf, multi_ex>& l = init_learner(data, base, CB_EXPLORE_ADF::do_actual_learning<true>,
      CB_EXPLORE_ADF::do_actual_learning<false>, problem_multiplier, prediction_type::action_probs);

  l.set_finish_example(CB_EXPLORE_ADF::finish_multiline_example);
  l.set_finish(CB_EXPLORE_ADF::finish);
  return make_base(l);
}